

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

void timeFunc(sqlite3_context *context,int argc,sqlite3_value **argv)

{
  int iVar1;
  DateTime x;
  char zBuf [100];
  DateTime DStack_a8;
  char local_78 [104];
  
  iVar1 = isDate(context,argc,argv,&DStack_a8);
  if (iVar1 == 0) {
    computeHMS(&DStack_a8);
    sqlite3_snprintf(100,local_78,"%02d:%02d:%02d",(ulong)(uint)DStack_a8.h,(ulong)(uint)DStack_a8.m
                     ,(ulong)(uint)(int)DStack_a8.s);
    setResultStrOrError(context,local_78,-1,'\x01',(_func_void_void_ptr *)0xffffffffffffffff);
  }
  return;
}

Assistant:

static void timeFunc(
  sqlite3_context *context,
  int argc,
  sqlite3_value **argv
){
  DateTime x;
  if( isDate(context, argc, argv, &x)==0 ){
    char zBuf[100];
    computeHMS(&x);
    sqlite3_snprintf(sizeof(zBuf), zBuf, "%02d:%02d:%02d", x.h, x.m, (int)x.s);
    sqlite3_result_text(context, zBuf, -1, SQLITE_TRANSIENT);
  }
}